

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Liby::Buffer::shrink_to_fit(Buffer *this,off_t len)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  off_t oVar4;
  char *pcVar5;
  size_t __n;
  ulong uVar6;
  char *newBuffer;
  off_t len_local;
  Buffer *this_local;
  
  oVar4 = size(this);
  if (len < oVar4) {
    oVar4 = size(this);
    shrink(this,oVar4);
  }
  else if (len < this->capacity_ - this->leftIndex_) {
    uVar6 = len + this->leftIndex_;
    if ((long)uVar6 < 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pcVar5 = (char *)operator_new__(uVar6);
    lVar1 = this->leftIndex_;
    pcVar2 = this->buffer_;
    lVar3 = this->leftIndex_;
    __n = size(this);
    memcpy(pcVar5 + lVar1,pcVar2 + lVar3,__n);
    if (this->buffer_ != (char *)0x0) {
      operator_delete__(this->buffer_);
    }
    this->buffer_ = pcVar5;
    this->capacity_ = len + this->leftIndex_;
  }
  return;
}

Assistant:

void Buffer::shrink_to_fit(off_t len) {
    if (len < size()) {
        shrink(size());
    } else if (len < capacity_ - leftIndex_) {
        char *newBuffer = new char[len + leftIndex_];
        ::memcpy(newBuffer + leftIndex_, buffer_ + leftIndex_, size());
        delete[] buffer_;
        buffer_ = newBuffer;
        capacity_ = len + leftIndex_;
    }
}